

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O2

int Lodtalk::SmallInteger::stIntegerDivide(InterpreterProxy *interpreter)

{
  int iVar1;
  undefined4 extraout_var;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar2;
  undefined4 extraout_var_01;
  SmallIntegerValue SVar3;
  SmallIntegerValue divisor;
  Oop b;
  Oop a;
  anon_union_8_4_0eb573b0_for_Oop_0 local_20;
  anon_union_8_4_0eb573b0_for_Oop_0 local_18;
  undefined4 extraout_var_00;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) == 1) {
    aVar2._0_4_ = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
    aVar2.uintValue._4_4_ = extraout_var_00;
    local_18 = aVar2;
    local_20._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    local_20.uintValue._4_4_ = extraout_var_01;
    if (((aVar2._0_4_ & 1) != 0) && ((local_20._0_4_ & 1) != 0)) {
      SVar3 = Oop::decodeSmallInteger((Oop *)&local_18);
      divisor = Oop::decodeSmallInteger((Oop *)&local_20);
      if (divisor == 0) {
        iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
      }
      else {
        SVar3 = divideRoundNeg(SVar3,divisor);
        iVar1 = (*interpreter->_vptr_InterpreterProxy[0x16])(interpreter,SVar3);
      }
      return iVar1;
    }
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
  return iVar1;
}

Assistant:

int SmallInteger::stIntegerDivide(InterpreterProxy *interpreter)
{
    if (interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    auto a = interpreter->getReceiver();
    auto b = interpreter->getTemporary(0);
    if (!a.isSmallInteger() || !b.isSmallInteger())
        return interpreter->primitiveFailed();

    auto ia = a.decodeSmallInteger();
    auto ib = b.decodeSmallInteger();
    if (ib == 0)
        return interpreter->primitiveFailed();
    return interpreter->returnInteger(divideRoundNeg(ia, ib));
}